

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus DecodeMovePRegPair(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint Reg;
  uint uVar1;
  
  uVar1 = Insn >> 5 & 0x1c;
  Reg = *(uint *)(&DAT_003dfae0 + uVar1);
  MCOperand_CreateReg0(Inst,*(uint *)(&DAT_003dfac0 + uVar1));
  MCOperand_CreateReg0(Inst,Reg);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMovePRegPair(MCInst *Inst, unsigned Insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned RegPair = fieldFromInstruction(Insn, 7, 3);

	switch (RegPair) {
		default:
			return MCDisassembler_Fail;
		case 0:
			MCOperand_CreateReg0(Inst, Mips_A1);
			MCOperand_CreateReg0(Inst, Mips_A2);
			break;
		case 1:
			MCOperand_CreateReg0(Inst, Mips_A1);
			MCOperand_CreateReg0(Inst, Mips_A3);
			break;
		case 2:
			MCOperand_CreateReg0(Inst, Mips_A2);
			MCOperand_CreateReg0(Inst, Mips_A3);
			break;
		case 3:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_S5);
			break;
		case 4:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_S6);
			break;
		case 5:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_A1);
			break;
		case 6:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_A2);
			break;
		case 7:
			MCOperand_CreateReg0(Inst, Mips_A0);
			MCOperand_CreateReg0(Inst, Mips_A3);
			break;
	}

	return MCDisassembler_Success;
}